

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O2

void Bbl_ManPrintStats(Bbl_Man_t *p)

{
  uint uVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  
  uVar5 = 0;
  uVar3 = 0;
  uVar4 = 0;
  while (((int)uVar5 < p->pObjs->nSize && (pcVar2 = p->pObjs->pArray, pcVar2 != (char *)0x0))) {
    uVar4 = (ulong)((int)uVar4 + 1);
    uVar1 = *(uint *)(pcVar2 + (ulong)uVar5 + 8);
    uVar7 = (uint)((uVar1 & 2) == 0);
    if ((uVar1 & 1) != 0) {
      uVar7 = 0;
    }
    uVar3 = (ulong)((int)uVar3 + uVar7);
    uVar5 = uVar5 + (uVar1 >> 4) * 4 + 0xc;
  }
  iVar6 = 0;
  uVar5 = 0;
  while( true ) {
    if ((p->pFncs->nSize <= iVar6) || (pcVar2 = p->pFncs->pArray, pcVar2 == (char *)0x0)) break;
    uVar5 = uVar5 + 1;
    iVar6 = iVar6 + *(int *)(pcVar2 + iVar6) * 4 + 4;
  }
  printf("Total objects = %7d.  Total nodes = %7d. Unique functions = %7d.\n",uVar4,uVar3,
         (ulong)uVar5);
  printf("Name manager = %5.2f MB\n",(double)p->pName->nSize * 9.5367431640625e-07);
  printf("Objs manager = %5.2f MB\n",(double)p->pObjs->nSize * 9.5367431640625e-07);
  printf("Fncs manager = %5.2f MB\n",(double)p->pFncs->nSize * 9.5367431640625e-07);
  return;
}

Assistant:

void Bbl_ManPrintStats( Bbl_Man_t * p )
{
    Bbl_Obj_t * pObj;
    Bbl_Fnc_t * pFnc;
    int h, nFuncs = 0, nNodes = 0, nObjs = 0;
    Bbl_ManForEachObj_int( p->pObjs, pObj, h )
        nObjs++, nNodes += Bbl_ObjIsNode(pObj);
    Bbl_ManForEachFnc_int( p->pFncs, pFnc, h )
        nFuncs++;
    printf( "Total objects = %7d.  Total nodes = %7d. Unique functions = %7d.\n", nObjs, nNodes, nFuncs );
    printf( "Name manager = %5.2f MB\n", 1.0*Vec_StrSize(p->pName)/(1 << 20) );
    printf( "Objs manager = %5.2f MB\n", 1.0*Vec_StrSize(p->pObjs)/(1 << 20) );
    printf( "Fncs manager = %5.2f MB\n", 1.0*Vec_StrSize(p->pFncs)/(1 << 20) );
}